

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_compact.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::CompactData::populate
          (CompactData *this,Locale *locale,char *nsName,CompactStyle compactStyle,
          CompactType compactType,UErrorCode *status)

{
  char cVar1;
  int iVar2;
  UErrorCode localStatus;
  LocalUResourceBundlePointer rb;
  CompactDataSink sink;
  CharString resourceKey;
  UErrorCode local_8c;
  LocalPointerBase<UResourceBundle> local_88;
  ResourceSink local_80;
  CompactData *local_78;
  CharString local_70;
  
  local_80.super_UObject._vptr_UObject = (UObject)&PTR__ResourceSink_003b41c0;
  local_78 = this;
  local_88.ptr = ures_open_63((char *)0x0,locale->fullName,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar2 = strcmp(nsName,"latn");
    MaybeStackArray<char,_40>::MaybeStackArray(&local_70.buffer);
    local_70.len = 0;
    *local_70.buffer.ptr = '\0';
    anon_unknown.dwarf_1fc934::getResourceBundleKey
              (nsName,compactStyle,compactType,&local_70,status);
    local_8c = U_ZERO_ERROR;
    ures_getAllItemsWithFallback_63(local_88.ptr,local_70.buffer.ptr,&local_80,&local_8c);
    cVar1 = this->isEmpty;
    if (cVar1 != '\0' && iVar2 != 0) {
      anon_unknown.dwarf_1fc934::getResourceBundleKey
                ("latn",compactStyle,compactType,&local_70,status);
      local_8c = U_ZERO_ERROR;
      ures_getAllItemsWithFallback_63(local_88.ptr,local_70.buffer.ptr,&local_80,&local_8c);
      cVar1 = this->isEmpty;
    }
    if (cVar1 != '\0' && compactStyle != UNUM_SHORT) {
      anon_unknown.dwarf_1fc934::getResourceBundleKey
                (nsName,UNUM_SHORT,compactType,&local_70,status);
      local_8c = U_ZERO_ERROR;
      ures_getAllItemsWithFallback_63(local_88.ptr,local_70.buffer.ptr,&local_80,&local_8c);
      cVar1 = this->isEmpty;
    }
    if (((compactStyle != UNUM_SHORT) && (cVar1 != '\0')) && (iVar2 != 0)) {
      anon_unknown.dwarf_1fc934::getResourceBundleKey
                ("latn",UNUM_SHORT,compactType,&local_70,status);
      local_8c = U_ZERO_ERROR;
      ures_getAllItemsWithFallback_63(local_88.ptr,local_70.buffer.ptr,&local_80,&local_8c);
      cVar1 = this->isEmpty;
    }
    if (cVar1 != '\0') {
      *status = U_INTERNAL_PROGRAM_ERROR;
    }
    MaybeStackArray<char,_40>::~MaybeStackArray(&local_70.buffer);
  }
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_88);
  ResourceSink::~ResourceSink(&local_80);
  return;
}

Assistant:

void CompactData::populate(const Locale &locale, const char *nsName, CompactStyle compactStyle,
                           CompactType compactType, UErrorCode &status) {
    CompactDataSink sink(*this);
    LocalUResourceBundlePointer rb(ures_open(nullptr, locale.getName(), &status));
    if (U_FAILURE(status)) { return; }

    bool nsIsLatn = strcmp(nsName, "latn") == 0;
    bool compactIsShort = compactStyle == CompactStyle::UNUM_SHORT;

    // Fall back to latn numbering system and/or short compact style.
    CharString resourceKey;
    getResourceBundleKey(nsName, compactStyle, compactType, resourceKey, status);
    UErrorCode localStatus = U_ZERO_ERROR;
    ures_getAllItemsWithFallback(rb.getAlias(), resourceKey.data(), sink, localStatus);
    if (isEmpty && !nsIsLatn) {
        getResourceBundleKey("latn", compactStyle, compactType, resourceKey, status);
        localStatus = U_ZERO_ERROR;
        ures_getAllItemsWithFallback(rb.getAlias(), resourceKey.data(), sink, localStatus);
    }
    if (isEmpty && !compactIsShort) {
        getResourceBundleKey(nsName, CompactStyle::UNUM_SHORT, compactType, resourceKey, status);
        localStatus = U_ZERO_ERROR;
        ures_getAllItemsWithFallback(rb.getAlias(), resourceKey.data(), sink, localStatus);
    }
    if (isEmpty && !nsIsLatn && !compactIsShort) {
        getResourceBundleKey("latn", CompactStyle::UNUM_SHORT, compactType, resourceKey, status);
        localStatus = U_ZERO_ERROR;
        ures_getAllItemsWithFallback(rb.getAlias(), resourceKey.data(), sink, localStatus);
    }

    // The last fallback should be guaranteed to return data.
    if (isEmpty) {
        status = U_INTERNAL_PROGRAM_ERROR;
    }
}